

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

SolveResult __thiscall Board::backtrack(Board *this,tile_index index,SolveResult *result)

{
  ulong uVar1;
  uint uVar2;
  SolveResult SVar3;
  ulong uVar4;
  pointer pTVar5;
  row row;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  TileValue TVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  TileValue TVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  
  uVar7 = (ulong)index;
  pTVar5 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar17 = true;
  if ((long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar5 >> 3 != uVar7) {
    if (pTVar5[uVar7].status == Solved) {
      SVar3 = backtrack(this,index + 1,result);
      if (((ulong)SVar3 >> 0x20 & 1) != 0) {
LAB_001050c2:
        uVar7 = (ulong)SVar3 >> 0x20;
        uVar13 = 0;
        goto LAB_0010528d;
      }
    }
    else {
      TVar14 = this->SIZE;
      if (TVar14 != Empty) {
        TVar10 = Empty;
        do {
          TVar10 = TVar10 + One;
          pTVar5 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar5[uVar7].value = TVar10;
          pTVar5[uVar7].status = Processing;
          uVar13 = (ulong)index / (ulong)TVar14;
          uVar1 = (ulong)index % (ulong)TVar14;
          iVar15 = 0;
          uVar4 = (ulong)TVar14;
          bVar17 = false;
          uVar9 = 1;
          do {
            if ((uVar9 - uVar1 != 1) && (pTVar5[(index - (int)uVar1) + iVar15].value == TVar10))
            break;
            iVar15 = iVar15 + 1;
            bVar17 = uVar4 <= uVar9;
            bVar18 = uVar9 != uVar4;
            uVar9 = uVar9 + 1;
          } while (bVar18);
          if (bVar17) {
            iVar15 = 0;
            bVar17 = false;
            uVar9 = 1;
            do {
              if ((uVar9 - uVar13 != 1) && (pTVar5[TVar14 * iVar15 + (int)uVar1].value == TVar10))
              break;
              iVar15 = iVar15 + 1;
              bVar17 = uVar4 <= uVar9;
              bVar18 = uVar9 != uVar4;
              uVar9 = uVar9 + 1;
            } while (bVar18);
            if (bVar17) {
              uVar8 = this->SQUARE_SIZE;
              uVar11 = ((int)(uVar1 / uVar8) + (int)uVar13) - (int)(uVar13 % (ulong)uVar8);
              uVar2 = uVar11 / uVar8;
              uVar11 = uVar11 % uVar8;
              uVar6 = uVar2 * uVar8;
              uVar2 = (uVar2 + 1) * uVar8 - 1;
              if (uVar6 <= uVar2) {
                uVar12 = uVar11 * uVar8;
                uVar8 = (uVar11 + 1) * uVar8 - 1;
                do {
                  if (uVar12 <= uVar8) {
                    uVar11 = uVar12;
                    do {
                      uVar16 = uVar11 + uVar6 * TVar14;
                      if ((uVar16 != index) && (pTVar5[uVar16].value == TVar10)) goto LAB_00105206;
                      uVar11 = uVar11 + 1;
                    } while (uVar11 <= uVar8);
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 <= uVar2);
              }
              SVar3 = backtrack(this,index + 1,result);
              if (((ulong)SVar3 >> 0x20 & 1) != 0) goto LAB_001050c2;
              TVar14 = this->SIZE;
            }
          }
LAB_00105206:
        } while (TVar10 < TVar14);
        pTVar5 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pTVar5[uVar7].value = Empty;
      pTVar5[uVar7].status = Empty;
    }
    result->backtracks = result->backtracks + 1;
    bVar17 = false;
  }
  result->solved = bVar17;
  uVar7 = (ulong)bVar17;
  SVar3.solved = bVar17;
  SVar3.backtracks = result->backtracks;
  SVar3._5_3_ = 0;
  uVar13 = (ulong)(byte)result->field_0x7 << 0x38 | (ulong)*(ushort *)&result->field_0x5 << 0x28;
LAB_0010528d:
  return (SolveResult)((ulong)SVar3 & 0xffffffff | (uVar7 & 0xff) << 0x20 | uVar13);
}

Assistant:

SolveResult Board::backtrack(tile_index index, SolveResult &result)
{
	if (index == _tiles.size())
	{
		result.solved = true;
		return result;
	}

	if (_tiles[index].status != TileStatus::Solved)
	{
		for (unsigned int i = 0; i < Board::SIZE; ++i)
		{
			_tiles[index].value = (TileValue)(i + 1);
			_tiles[index].status = TileStatus::Processing;

			if (isTileInsertionValid(index))
			{
				auto r = backtrack(index + 1, result);
				if (r.solved)
					return r;
			}
		}

		_tiles[index].value = TileValue::Empty;
		_tiles[index].status = TileStatus::Empty;
	}
	else
	{
		auto r = backtrack(index + 1, result);
		if (r.solved)
			return r;
	}

	++result.backtracks;
	result.solved = false;
	return result;
}